

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtk_writer.cc
# Opt level: O0

uint lf::io::anon_unknown_1::NumAuxNodes(RefEl ref_el,uchar order)

{
  RefElType RVar1;
  ostream *poVar2;
  runtime_error *this;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  stringstream local_198 [8];
  stringstream ss;
  ostream local_188 [378];
  byte local_e;
  RefEl local_d;
  uint local_c;
  uchar order_local;
  RefEl ref_el_local;
  
  local_e = order;
  local_d.type_ = ref_el.type_;
  RVar1 = lf::base::RefEl::operator_cast_to_RefElType(&local_d);
  switch(RVar1) {
  case kPoint:
    local_c = 1;
    break;
  case kSegment:
    local_c = local_e - 1;
    break;
  case kTria:
    local_c = (int)((uint)local_e * -3 + 2 + (uint)local_e * (uint)local_e) / 2;
    break;
  case kQuad:
    local_c = (local_e - 1) * (local_e - 1);
    break;
  default:
    std::__cxx11::stringstream::stringstream(local_198);
    poVar2 = std::operator<<(local_188,"RefElType ");
    poVar2 = lf::base::operator<<(poVar2,&local_d);
    std::operator<<(poVar2," not supported.");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"false",&local_1c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/vtk_writer.cc"
               ,&local_1f1);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1c8,&local_1f0,0x1da,&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator(&local_1f1);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator(&local_1c9);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"this code should not be reached");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_c;
}

Assistant:

unsigned int NumAuxNodes(base::RefEl ref_el, unsigned char order) {
  switch (ref_el) {
    case base::RefEl::kPoint():
      return 1;
    case base::RefEl::kSegment():
      return order - 1;
    case base::RefEl::kTria():
      return (2 - 3 * order + order * order) / 2;
    case base::RefEl::kQuad():
      return (order - 1) * (order - 1);
    default:
      LF_VERIFY_MSG(false, "RefElType " << ref_el << " not supported.");
  }
}